

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

size_t WriteMetadataHeader(BrotliEncoderState *s,size_t block_size,uint8_t *header)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int local_1bc;
  uint32_t nbytes;
  uint32_t nbits;
  size_t storage_ix;
  uint8_t *header_local;
  size_t block_size_local;
  BrotliEncoderState *s_local;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  bVar1 = s->last_bytes_bits_;
  uVar4 = (ulong)bVar1;
  *header = (uint8_t)s->last_bytes_;
  header[1] = (uint8_t)(s->last_bytes_ >> 8);
  s->last_bytes_ = 0;
  s->last_bytes_bits_ = '\0';
  *(ulong *)(header + (bVar1 >> 3)) =
       0L << (bVar1 & 7) | (ulong)(byte)*(ulong *)(header + (bVar1 >> 3));
  *(ulong *)(header + (uVar4 + 1 >> 3)) =
       3L << ((byte)(uVar4 + 1) & 7) | (ulong)(byte)*(ulong *)(header + (uVar4 + 1 >> 3));
  *(ulong *)(header + (uVar4 + 3 >> 3)) =
       0L << ((byte)(uVar4 + 3) & 7) | (ulong)(byte)*(ulong *)(header + (uVar4 + 3 >> 3));
  uVar3 = uVar4 + 4;
  if (block_size == 0) {
    *(ulong *)(header + (uVar3 >> 3)) =
         0L << ((byte)uVar3 & 7) | (ulong)(byte)*(ulong *)(header + (uVar3 >> 3));
    _nbytes = uVar4 + 6;
  }
  else {
    if (block_size == 1) {
      local_1bc = 0;
    }
    else {
      uVar2 = (int)block_size - 1;
      local_1bc = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> local_1bc == 0; local_1bc = local_1bc + -1) {
        }
      }
      local_1bc = local_1bc + 1;
    }
    uVar2 = local_1bc + 7U >> 3;
    *(ulong *)(header + (uVar3 >> 3)) =
         (ulong)uVar2 << ((byte)uVar3 & 7) | (ulong)(byte)*(ulong *)(header + (uVar3 >> 3));
    uVar4 = uVar4 + 6;
    *(size_t *)(header + (uVar4 >> 3)) =
         block_size - 1 << ((byte)uVar4 & 7) | (ulong)(byte)*(ulong *)(header + (uVar4 >> 3));
    _nbytes = (uVar2 << 3) + uVar4;
  }
  return _nbytes + 7U >> 3;
}

Assistant:

static size_t WriteMetadataHeader(
    BrotliEncoderState* s, const size_t block_size, uint8_t* header) {
  size_t storage_ix;
  storage_ix = s->last_bytes_bits_;
  header[0] = (uint8_t)s->last_bytes_;
  header[1] = (uint8_t)(s->last_bytes_ >> 8);
  s->last_bytes_ = 0;
  s->last_bytes_bits_ = 0;

  BrotliWriteBits(1, 0, &storage_ix, header);
  BrotliWriteBits(2, 3, &storage_ix, header);
  BrotliWriteBits(1, 0, &storage_ix, header);
  if (block_size == 0) {
    BrotliWriteBits(2, 0, &storage_ix, header);
  } else {
    uint32_t nbits = (block_size == 1) ? 0 :
        (Log2FloorNonZero((uint32_t)block_size - 1) + 1);
    uint32_t nbytes = (nbits + 7) / 8;
    BrotliWriteBits(2, nbytes, &storage_ix, header);
    BrotliWriteBits(8 * nbytes, block_size - 1, &storage_ix, header);
  }
  return (storage_ix + 7u) >> 3;
}